

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,qint64 key)

{
  long lVar1;
  bool bVar2;
  QCborContainerPrivate *pQVar3;
  QCborContainerPrivate *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  QCborValueRef QVar4;
  QCborContainerPrivate *in_stack_ffffffffffffffb8;
  QCborValueRef *in_stack_ffffffffffffffc0;
  QCborContainerPrivate *in_stack_ffffffffffffffc8;
  undefined1 local_18 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = shouldArrayRemainArray
                    ((qint64)in_RSI,(Type)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffc8);
  if (bVar2) {
    pQVar3 = maybeGrow(in_RSI,in_RDI);
    *(QCborContainerPrivate **)(in_RDI + 8) = pQVar3;
    QCborValueRef::QCborValueRef(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x470ff3);
  }
  else {
    local_18 = (undefined1  [16])
               QCborContainerPrivate::findOrAddMapKey<long_long>
                         ((QCborValue *)in_stack_ffffffffffffffc8,
                          (longlong)in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar4.super_QCborValueConstRef.d = (QCborContainerPrivate *)local_18._0_8_;
    QVar4.super_QCborValueConstRef.i = local_18._8_8_;
    return (QCborValueRef)QVar4.super_QCborValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

QCborValueRef QCborValue::operator[](qint64 key)
{
    if (shouldArrayRemainArray(key, t, container)) {
        container = maybeGrow(container, key);
        return { container, qsizetype(key) };
    }
    return QCborContainerPrivate::findOrAddMapKey(*this, key);
}